

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprRefNull(BinaryReaderIR *this,Index index)

{
  char *__s;
  ExprList *pEVar1;
  Offset OVar2;
  Expr *pEVar3;
  size_t sVar4;
  Expr *pEVar5;
  ExprList *pEVar6;
  
  __s = this->filename_;
  sVar4 = strlen(__s);
  pEVar1 = this->current_init_expr_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  pEVar5 = (Expr *)operator_new(0x40);
  (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar5->loc).filename.data_ = __s;
  (pEVar5->loc).filename.size_ = sVar4;
  (pEVar5->loc).field_1.field_1.offset = OVar2;
  *(undefined8 *)((long)&(pEVar5->loc).field_1 + 8) = 0;
  pEVar5->type_ = RefNull;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_00183b00;
  if (((pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar5->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar3 = pEVar1->last_;
    pEVar6 = pEVar1;
    if (pEVar3 != (Expr *)0x0) {
      (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar6 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar6->first_ = pEVar5;
    pEVar1->last_ = pEVar5;
    pEVar1->size_ = pEVar1->size_ + 1;
    return (Result)Ok;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

Result BinaryReaderIR::OnInitExprRefNull(Index index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(MakeUnique<RefNullExpr>(loc));
  return Result::Ok;
}